

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_decals.cpp
# Opt level: O3

DImpactDecal *
DImpactDecal::StaticCreate
          (FDecalTemplate *tpl,DVector3 *pos,side_t *wall,F3DFloor *ffloor,PalEntry color)

{
  byte bVar1;
  int iVar2;
  FTextureID FVar3;
  undefined4 extraout_var;
  DBaseDecal *this;
  uint r;
  anon_union_4_2_12391d7c_for_PalEntry_0 color_00;
  uint g;
  
  if (((tpl != (FDecalTemplate *)0x0) && (0 < cl_maxdecals.Value)) && ((wall->Flags & 2) == 0)) {
    if (tpl->LowerDecal != (FDecalBase *)0x0) {
      iVar2 = (**tpl->LowerDecal->_vptr_FDecalBase)();
      color_00.d = 0;
      if (tpl->ShadeColor == ((FDecalTemplate *)CONCAT44(extraout_var,iVar2))->ShadeColor) {
        color_00 = color.field_0;
      }
      StaticCreate((FDecalTemplate *)CONCAT44(extraout_var,iVar2),pos,wall,ffloor,
                   (PalEntry)color_00.field_0);
    }
    CheckMax();
    this = (DBaseDecal *)
           M_Malloc_Dbg(0x98,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./dobject.h"
                        ,0x1f9);
    DImpactDecal((DImpactDecal *)this,pos->Z);
    FVar3 = DBaseDecal::StickToWall(this,wall,pos->X,pos->Y,ffloor);
    if (0 < FVar3.texnum) {
      FDecalTemplate::ApplyToDecal(tpl,this,wall);
      r = (uint)color.field_0 >> 0x10 & 0xff;
      g = (uint)color.field_0 >> 8 & 0xff;
      if ((((uint)color.field_0 & 0xff0000ff) != 0 || r != 0) || g != 0) {
        bVar1 = FColorMatcher::Pick(&ColorMatcher,r,g,(uint)color.field_0 & 0xff);
        this->AlphaColor = g << 8 | (uint)color.field_0 & 0xff | (uint)bVar1 << 0x18 | r << 0x10;
      }
      if (cl_spreaddecals.Value == true) {
        if (0 < (this->PicNum).texnum) {
          DBaseDecal::Spread(this,tpl,wall,pos->X,pos->Y,pos->Z,ffloor);
          return (DImpactDecal *)this;
        }
        return (DImpactDecal *)this;
      }
      return (DImpactDecal *)this;
    }
  }
  return (DImpactDecal *)0x0;
}

Assistant:

DImpactDecal *DImpactDecal::StaticCreate (const FDecalTemplate *tpl, const DVector3 &pos, side_t *wall, F3DFloor * ffloor, PalEntry color)
{
	DImpactDecal *decal = NULL;
	if (tpl != NULL && cl_maxdecals > 0 && !(wall->Flags & WALLF_NOAUTODECALS))
	{
		if (tpl->LowerDecal)
		{
			int lowercolor;
			const FDecalTemplate * tpl_low = tpl->LowerDecal->GetDecal();

			// If the default color of the lower decal is the same as the main decal's
			// apply the custom color as well.
			if (tpl->ShadeColor != tpl_low->ShadeColor) lowercolor=0;
			else lowercolor = color;
			StaticCreate (tpl_low, pos, wall, ffloor, lowercolor);
		}
		DImpactDecal::CheckMax();
		decal = new DImpactDecal (pos.Z);
		if (decal == NULL)
		{
			return NULL;
		}

		if (!decal->StickToWall (wall, pos.X, pos.Y, ffloor).isValid())
		{
			return NULL;
		}

		tpl->ApplyToDecal (decal, wall);
		if (color != 0)
		{
			decal->SetShade (color.r, color.g, color.b);
		}

		if (!cl_spreaddecals || !decal->PicNum.isValid())
		{
			return decal;
		}

		// Spread decal to nearby walls if it does not all fit on this one
		decal->Spread (tpl, wall, pos.X, pos.Y, pos.Z, ffloor);
	}
	return decal;
}